

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DLevelScript::SetActorProperty(DLevelScript *this,int tid,int property,int value)

{
  AActor *actor_00;
  undefined1 local_38 [8];
  FActorIterator iterator;
  AActor *actor;
  int value_local;
  int property_local;
  int tid_local;
  DLevelScript *this_local;
  
  if (tid == 0) {
    actor_00 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->activator);
    DoSetActorProperty(this,actor_00,property,value);
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_38,tid);
    while (iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_38),
          (AActor *)iterator._8_8_ != (AActor *)0x0) {
      DoSetActorProperty(this,(AActor *)iterator._8_8_,property,value);
    }
  }
  return;
}

Assistant:

void DLevelScript::SetActorProperty (int tid, int property, int value)
{
	if (tid == 0)
	{
		DoSetActorProperty (activator, property, value);
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (tid);

		while ((actor = iterator.Next()) != NULL)
		{
			DoSetActorProperty (actor, property, value);
		}
	}
}